

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O0

void tsgSetAnisotropicRefinement(void *grid,char *sType,int min_growth,int output,int *level_limits)

{
  TypeDepth TVar1;
  ostream *poVar2;
  allocator<char> local_51;
  string local_50;
  TypeDepth local_2c;
  int *piStack_28;
  TypeDepth depth_type;
  int *level_limits_local;
  int output_local;
  int min_growth_local;
  char *sType_local;
  void *grid_local;
  
  piStack_28 = level_limits;
  level_limits_local._0_4_ = output;
  level_limits_local._4_4_ = min_growth;
  _output_local = sType;
  sType_local = (char *)grid;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,sType,&local_51);
  TVar1 = TasGrid::IO::getDepthTypeString(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_2c = TVar1;
  if (TVar1 == type_none) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: incorrect depth type: ");
    poVar2 = std::operator<<(poVar2,_output_local);
    poVar2 = std::operator<<(poVar2,", defaulting to type_iptotal.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if (local_2c == type_none) {
    local_2c = type_iptotal;
  }
  TasGrid::TasmanianSparseGrid::setAnisotropicRefinement
            ((TasmanianSparseGrid *)sType_local,local_2c,level_limits_local._4_4_,
             (int)level_limits_local,piStack_28);
  return;
}

Assistant:

void tsgSetAnisotropicRefinement(void *grid, const char * sType, int min_growth, int output, const int *level_limits){
    TypeDepth depth_type = IO::getDepthTypeString(sType);
    #ifndef NDEBUG
    if (depth_type == type_none){ cerr << "WARNING: incorrect depth type: " << sType << ", defaulting to type_iptotal." << endl; }
    #endif // NDEBUG
    if (depth_type == type_none){ depth_type = type_iptotal; }
    ((TasmanianSparseGrid*) grid)->setAnisotropicRefinement(depth_type, min_growth, output, level_limits);
}